

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O0

void count_zero_samples(png_structp png_ptr,png_row_infop row_info,png_bytep data)

{
  byte bVar1;
  png_byte pVar2;
  byte *pbVar3;
  png_bytep ppVar4;
  png_uint_32 pVar5;
  uint local_44;
  int local_40;
  int color_channels;
  int channel;
  png_uint_32 nstop_1;
  png_uint_32 n_1;
  png_uint_32 nstop;
  png_uint_32 n;
  int pos;
  png_bytep dp;
  png_bytep data_local;
  png_row_infop row_info_local;
  png_structp png_ptr_local;
  
  if (png_ptr != (png_structp)0x0) {
    _n = data;
    if ((row_info->color_type == '\0') || (row_info->color_type == '\x03')) {
      nstop = 0;
      n_1 = 0;
      for (; n_1 < row_info->width; n_1 = n_1 + 1) {
        if (row_info->bit_depth == '\x01') {
          pVar5 = nstop + 1;
          if (((uint)*_n << ((byte)nstop & 0x1f) & 0x80) == 0) {
            zero_samples = zero_samples + 1;
          }
          nstop = pVar5;
          if (pVar5 == 8) {
            nstop = 0;
            _n = _n + 1;
          }
        }
        if (row_info->bit_depth == '\x02') {
          nstop = nstop + 2;
          if (((uint)*_n << ((byte)nstop & 0x1f) & 0xc0) == 0) {
            zero_samples = zero_samples + 1;
          }
          if (nstop == 8) {
            nstop = 0;
            _n = _n + 1;
          }
        }
        if (row_info->bit_depth == '\x04') {
          nstop = nstop + 4;
          if (((uint)*_n << ((byte)nstop & 0x1f) & 0xf0) == 0) {
            zero_samples = zero_samples + 1;
          }
          if (nstop == 8) {
            nstop = 0;
            _n = _n + 1;
          }
        }
        if ((row_info->bit_depth == '\b') && (pbVar3 = _n + 1, bVar1 = *_n, _n = pbVar3, bVar1 == 0)
           ) {
          zero_samples = zero_samples + 1;
        }
        if (row_info->bit_depth == '\x10') {
          if (*_n == 0 && _n[1] == 0) {
            zero_samples = zero_samples + 1;
          }
          _n = _n + 2;
        }
      }
    }
    else {
      local_44 = (uint)row_info->channels;
      if (3 < row_info->color_type) {
        local_44 = local_44 - 1;
      }
      channel = 0;
      for (; (uint)channel < row_info->width; channel = channel + 1) {
        for (local_40 = 0; local_40 < (int)local_44; local_40 = local_40 + 1) {
          if ((row_info->bit_depth == '\b') &&
             (ppVar4 = _n + 1, pVar2 = *_n, _n = ppVar4, pVar2 == '\0')) {
            zero_samples = zero_samples + 1;
          }
          if (row_info->bit_depth == '\x10') {
            if (*_n == '\0' && _n[1] == '\0') {
              zero_samples = zero_samples + 1;
            }
            _n = _n + 2;
          }
        }
        ppVar4 = _n;
        if ((3 < row_info->color_type) && (ppVar4 = _n + 1, row_info->bit_depth == '\x10')) {
          ppVar4 = _n + 2;
        }
        _n = ppVar4;
      }
    }
  }
  return;
}

Assistant:

static void PNGCBAPI
count_zero_samples(png_structp png_ptr, png_row_infop row_info, png_bytep data)
{
   png_bytep dp = data;
   if (png_ptr == NULL)
      return;

   /* Contents of row_info:
    *  png_uint_32 width      width of row
    *  png_uint_32 rowbytes   number of bytes in row
    *  png_byte color_type    color type of pixels
    *  png_byte bit_depth     bit depth of samples
    *  png_byte channels      number of channels (1-4)
    *  png_byte pixel_depth   bits per pixel (depth*channels)
    */

   /* Counts the number of zero samples (or zero pixels if color_type is 3 */

   if (row_info->color_type == 0 || row_info->color_type == 3)
   {
      int pos = 0;
      png_uint_32 n, nstop;

      for (n = 0, nstop=row_info->width; n<nstop; n++)
      {
         if (row_info->bit_depth == 1)
         {
            if (((*dp << pos++ ) & 0x80) == 0)
               zero_samples++;

            if (pos == 8)
            {
               pos = 0;
               dp++;
            }
         }

         if (row_info->bit_depth == 2)
         {
            if (((*dp << (pos+=2)) & 0xc0) == 0)
               zero_samples++;

            if (pos == 8)
            {
               pos = 0;
               dp++;
            }
         }

         if (row_info->bit_depth == 4)
         {
            if (((*dp << (pos+=4)) & 0xf0) == 0)
               zero_samples++;

            if (pos == 8)
            {
               pos = 0;
               dp++;
            }
         }

         if (row_info->bit_depth == 8)
            if (*dp++ == 0)
               zero_samples++;

         if (row_info->bit_depth == 16)
         {
            if ((*dp | *(dp+1)) == 0)
               zero_samples++;
            dp+=2;
         }
      }
   }
   else /* Other color types */
   {
      png_uint_32 n, nstop;
      int channel;
      int color_channels = row_info->channels;
      if (row_info->color_type > 3)
         color_channels--;

      for (n = 0, nstop=row_info->width; n<nstop; n++)
      {
         for (channel = 0; channel < color_channels; channel++)
         {
            if (row_info->bit_depth == 8)
               if (*dp++ == 0)
                  zero_samples++;

            if (row_info->bit_depth == 16)
            {
               if ((*dp | *(dp+1)) == 0)
                  zero_samples++;

               dp+=2;
            }
         }
         if (row_info->color_type > 3)
         {
            dp++;
            if (row_info->bit_depth == 16)
               dp++;
         }
      }
   }
}